

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QList<QWidgetItemData>_>::insert
          (QMovableArrayOps<QList<QWidgetItemData>_> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QList<QWidgetItemData> *pQVar2;
  long lVar3;
  qsizetype inserts;
  long in_FS_OFFSET;
  bool bVar4;
  QArrayDataPointer<QWidgetItemData> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (t->d).d;
  local_48.ptr = (t->d).ptr;
  local_48.size = (t->d).size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar4 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
          super_QArrayDataPointer<QList<QWidgetItemData>_>.size != 0;
  QArrayDataPointer<QList<QWidgetItemData>_>::detachAndGrow
            ((QArrayDataPointer<QList<QWidgetItemData>_> *)this,(uint)(i == 0 && bVar4),n,
             (QList<QWidgetItemData> **)0x0,(QArrayDataPointer<QList<QWidgetItemData>_> *)0x0);
  if (i == 0 && bVar4) {
    if (n != 0) {
      pQVar2 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
               super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr;
      do {
        pQVar2[-1].d.d = local_48.d;
        pQVar2[-1].d.ptr = local_48.ptr;
        pQVar2[-1].d.size = local_48.size;
        if (local_48.d != (Data *)0x0) {
          LOCK();
          ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar2 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
                   super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr;
        }
        n = n + -1;
        pQVar2 = pQVar2 + -1;
        (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
        super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr = pQVar2;
        pqVar1 = &(this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
                  super_QArrayDataPointer<QList<QWidgetItemData>_>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    pQVar2 = (this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
             super_QArrayDataPointer<QList<QWidgetItemData>_>.ptr + i;
    memmove(pQVar2 + n,pQVar2,
            ((this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
             super_QArrayDataPointer<QList<QWidgetItemData>_>.size - i) * 0x18);
    lVar3 = n;
    if (n != 0) {
      do {
        (pQVar2->d).d = local_48.d;
        (pQVar2->d).ptr = local_48.ptr;
        (pQVar2->d).size = local_48.size;
        if (local_48.d != (Data *)0x0) {
          LOCK();
          ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar3 = lVar3 + -1;
        pQVar2 = pQVar2 + 1;
      } while (lVar3 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<QList<QWidgetItemData>_>).
              super_QArrayDataPointer<QList<QWidgetItemData>_>.size;
    *pqVar1 = *pqVar1 + n;
  }
  QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }